

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_lsp2lpc(HTS_Vocoder *v,double *lsp,double *a,int m)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *b;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar13;
  int iVar14;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  long lVar12;
  long lVar15;
  
  if ((m & 1U) == 0) {
    uVar9 = (ulong)(uint)(m >> 1);
    uVar13 = uVar9;
  }
  else {
    uVar9 = (ulong)(uint)(m + 1 >> 1);
    uVar13 = (ulong)(uint)(m + -1 >> 1);
  }
  uVar16 = (ulong)m;
  b = v->lsp2lpc_buff;
  if (v->lsp2lpc_size < uVar16) {
    if (b != (double *)0x0) {
      HTS_free(b);
    }
    b = (double *)HTS_calloc((long)(m * 5 + 6),8);
    v->lsp2lpc_buff = b;
    v->lsp2lpc_size = uVar16;
  }
  iVar11 = (int)uVar9;
  lVar12 = (long)iVar11;
  iVar14 = (int)uVar13;
  lVar15 = (long)iVar14;
  pdVar1 = b + uVar16 + lVar12 + lVar15;
  lVar4 = lVar12 * 8 + 8;
  lVar5 = lVar12 * 0x10 + 0x10;
  pdVar3 = pdVar1 + lVar12 * 3 + 3;
  lVar2 = lVar15 * 8 + 8;
  HTS_movem(lsp,b,m);
  uVar7 = 0;
  uVar10 = (ulong)(iVar11 + 1U);
  if ((int)(iVar11 + 1U) < 1) {
    uVar10 = uVar7;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    b[lVar12 + uVar16 + lVar15 + uVar7] = 0.0;
  }
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    b[lVar15 + uVar16 + lVar12 * 2 + uVar7 + 1] = 0.0;
  }
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pdVar1[lVar12 * 2 + uVar7 + 2] = 0.0;
  }
  uVar7 = 0;
  uVar10 = (ulong)(iVar14 + 1U);
  if ((int)(iVar14 + 1U) < 1) {
    uVar10 = uVar7;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pdVar3[uVar7] = 0.0;
  }
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pdVar3[lVar15 + uVar7 + 1] = 0.0;
  }
  lVar6 = lVar15 * 0x18 + lVar12 * 0x20 + uVar16 * 8 + 0x28;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    b[uVar16 + lVar12 * 4 + lVar15 * 3 + uVar7 + 5] = 0.0;
  }
  uVar10 = 0;
  if (iVar11 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 << 3 != uVar10; uVar10 = uVar10 + 8) {
    dVar17 = cos(*(double *)((long)v->lsp2lpc_buff + uVar10 * 2));
    *(double *)((long)b + uVar10 + uVar16 * 8) = dVar17 * -2.0;
  }
  uVar10 = 0;
  if (iVar14 < 1) {
    uVar13 = uVar10;
  }
  for (; uVar13 << 3 != uVar10; uVar10 = uVar10 + 8) {
    dVar17 = cos(*(double *)((long)v->lsp2lpc_buff + uVar10 * 2 + 8));
    *(double *)((long)b + uVar10 + lVar12 * 8 + uVar16 * 8) = dVar17 * -2.0;
  }
  dVar19 = 0.0;
  dVar17 = 1.0;
  dVar20 = 0.0;
  for (lVar8 = 0; dVar18 = dVar17, lVar8 <= (long)uVar16; lVar8 = lVar8 + 1) {
    dVar21 = dVar20;
    dVar17 = dVar20;
    if ((m & 1U) != 0) {
      dVar17 = -0.0;
      dVar21 = dVar19;
    }
    *pdVar1 = dVar17 + dVar18;
    *pdVar3 = dVar18 - dVar21;
    for (uVar10 = 0; uVar9 << 3 != uVar10; uVar10 = uVar10 + 8) {
      *(double *)((long)pdVar1 + uVar10 + 8) =
           *(double *)((long)b + uVar10 + uVar16 * 8) * *(double *)((long)pdVar1 + uVar10 + lVar4) +
           *(double *)((long)pdVar1 + uVar10) + *(double *)((long)pdVar1 + uVar10 + lVar5);
      *(undefined8 *)((long)pdVar1 + uVar10 + lVar5) =
           *(undefined8 *)((long)pdVar1 + uVar10 + lVar4);
      *(undefined8 *)((long)pdVar1 + uVar10 + lVar4) = *(undefined8 *)((long)pdVar1 + uVar10);
    }
    for (uVar10 = 0; uVar13 << 3 != uVar10; uVar10 = uVar10 + 8) {
      *(double *)((long)pdVar3 + uVar10 + 8) =
           *(double *)((long)b + uVar10 + lVar12 * 8 + uVar16 * 8) *
           *(double *)((long)pdVar3 + uVar10 + lVar2) + *(double *)((long)pdVar3 + uVar10) +
           *(double *)((long)b + uVar10 + lVar6);
      *(undefined8 *)((long)b + uVar10 + lVar6) = *(undefined8 *)((long)pdVar3 + uVar10 + lVar2);
      *(undefined8 *)((long)pdVar3 + uVar10 + lVar2) = *(undefined8 *)((long)pdVar3 + uVar10);
    }
    if ((m & 1U) != 0) {
      dVar19 = dVar20;
    }
    if (lVar8 != 0) {
      a[lVar8 + -1] = (pdVar1[lVar12] + pdVar3[lVar15]) * -0.5;
    }
    dVar17 = 0.0;
    dVar20 = dVar18;
  }
  for (uVar9 = (ulong)(uint)m; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
    a[uVar9] = -a[uVar9 - 1];
  }
  *a = 1.0;
  return;
}

Assistant:

static void HTS_lsp2lpc(HTS_Vocoder * v, double *lsp, double *a, const int m)
{
   int i, k, mh1, mh2, flag_odd;
   double xx, xf, xff;
   double *p, *q;
   double *a0, *a1, *a2, *b0, *b1, *b2;

   flag_odd = 0;
   if (m % 2 == 0)
      mh1 = mh2 = m / 2;
   else {
      mh1 = (m + 1) / 2;
      mh2 = (m - 1) / 2;
      flag_odd = 1;
   }

   if (m > v->lsp2lpc_size) {
      if (v->lsp2lpc_buff != NULL)
         HTS_free(v->lsp2lpc_buff);
      v->lsp2lpc_buff = (double *) HTS_calloc(5 * m + 6, sizeof(double));
      v->lsp2lpc_size = m;
   }
   p = v->lsp2lpc_buff + m;
   q = p + mh1;
   a0 = q + mh2;
   a1 = a0 + (mh1 + 1);
   a2 = a1 + (mh1 + 1);
   b0 = a2 + (mh1 + 1);
   b1 = b0 + (mh2 + 1);
   b2 = b1 + (mh2 + 1);

   HTS_movem(lsp, v->lsp2lpc_buff, m);

   for (i = 0; i < mh1 + 1; i++)
      a0[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a1[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a2[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b0[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b1[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b2[i] = 0.0;

   /* lsp filter parameters */
   for (i = k = 0; i < mh1; i++, k += 2)
      p[i] = -2.0 * cos(v->lsp2lpc_buff[k]);
   for (i = k = 0; i < mh2; i++, k += 2)
      q[i] = -2.0 * cos(v->lsp2lpc_buff[k + 1]);

   /* impulse response of analysis filter */
   xx = 1.0;
   xf = xff = 0.0;

   for (k = 0; k <= m; k++) {
      if (flag_odd) {
         a0[0] = xx;
         b0[0] = xx - xff;
         xff = xf;
         xf = xx;
      } else {
         a0[0] = xx + xf;
         b0[0] = xx - xf;
         xf = xx;
      }

      for (i = 0; i < mh1; i++) {
         a0[i + 1] = a0[i] + p[i] * a1[i] + a2[i];
         a2[i] = a1[i];
         a1[i] = a0[i];
      }

      for (i = 0; i < mh2; i++) {
         b0[i + 1] = b0[i] + q[i] * b1[i] + b2[i];
         b2[i] = b1[i];
         b1[i] = b0[i];
      }

      if (k != 0)
         a[k - 1] = -0.5 * (a0[mh1] + b0[mh2]);
      xx = 0.0;
   }

   for (i = m - 1; i >= 0; i--)
      a[i + 1] = -a[i];
   a[0] = 1.0;
}